

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

ON_DimStyle *
ON_DimStyle::CreateFromProperties
          (ON_DimStyle *__return_storage_ptr__,ON_DimStyle *parent_dim_style,
          AnnotationType annotation_type,ON_Font *font,double model_space_text_scale,
          double text_height,LengthUnitSystem text_height_unit_system,TextVerticalAlignment valign,
          TextHorizontalAlignment halign,TextOrientation orientation,TextLocation dim_text_location)

{
  TextVerticalAlignment valign_local;
  LengthUnitSystem text_height_unit_system_local;
  double text_height_local;
  double model_space_text_scale_local;
  ON_Font *font_local;
  AnnotationType annotation_type_local;
  ON_DimStyle *parent_dim_style_local;
  ON_DimStyle *dim_style;
  
  CreateOverrideCandidate(__return_storage_ptr__,parent_dim_style);
  Internal_CreateFromProperties
            (parent_dim_style,annotation_type,font,model_space_text_scale,text_height,
             text_height_unit_system,true,valign,halign,true,orientation,true,dim_text_location,
             __return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const ON_DimStyle ON_DimStyle::CreateFromProperties(
  const ON_DimStyle& parent_dim_style,
  ON::AnnotationType annotation_type,
  const ON_Font* font,
  double model_space_text_scale,
  double text_height,
  ON::LengthUnitSystem text_height_unit_system,
  ON::TextVerticalAlignment valign,
  ON::TextHorizontalAlignment halign,
  ON::TextOrientation orientation,
  ON_DimStyle::TextLocation dim_text_location
  )
{
  ON_DimStyle dim_style(parent_dim_style.CreateOverrideCandidate());

  Internal_CreateFromProperties(
    parent_dim_style,
    annotation_type,
    font,
    model_space_text_scale,
    text_height,
    text_height_unit_system,
    true,
    valign,
    halign,
    true,
    orientation,
    true,
    dim_text_location,
    dim_style
  );

  return dim_style;
}